

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O3

void __thiscall
CryptoUtil_EncryptAes256DataEmpty_Test::~CryptoUtil_EncryptAes256DataEmpty_Test
          (CryptoUtil_EncryptAes256DataEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256DataEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData byte_data = CryptoUtil::EncryptAes256(key.GetBytes(), "");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256 error.");
    return;
  }
  ASSERT_TRUE(false);
}